

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImage
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p_min,ImVec2 *p_max,ImVec2 *uv_min,
          ImVec2 *uv_max,ImU32 col)

{
  uint uVar1;
  
  if (col < 0x1000000) {
    return;
  }
  uVar1 = (this->_TextureIdStack).Size;
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x538,"T &ImVector<void *>::back() [T = void *]");
    }
    if ((this->_TextureIdStack).Data[(ulong)uVar1 - 1] == user_texture_id) {
      PrimReserve(this,6,4);
      PrimRectUV(this,p_min,p_max,uv_min,uv_max,col);
      return;
    }
  }
  PushTextureID(this,user_texture_id);
  PrimReserve(this,6,4);
  PrimRectUV(this,p_min,p_max,uv_min,uv_max,col);
  PopTextureID(this);
  return;
}

Assistant:

void ImDrawList::AddImage(ImTextureID user_texture_id, const ImVec2& p_min, const ImVec2& p_max, const ImVec2& uv_min, const ImVec2& uv_max, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimRectUV(p_min, p_max, uv_min, uv_max, col);

    if (push_texture_id)
        PopTextureID();
}